

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O3

Expression *
soul::ExpressionHelpers::create
          (Expression *__return_storage_ptr__,Expression *e,StringDictionary *dictionary)

{
  long *plVar1;
  long lVar2;
  QualifiedIdentifier *q;
  long lVar3;
  Expression *this;
  Expression result;
  _Any_data local_348;
  code *local_338;
  code *local_330;
  Expression local_328;
  Expression local_310;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  Expression local_178;
  Expression local_160;
  Expression local_148;
  Expression local_130;
  Expression local_118;
  Expression local_100;
  Expression local_e8;
  Expression local_d0;
  Expression local_b8;
  Expression local_a0;
  Expression local_88;
  Expression local_70;
  string local_58;
  pool_ptr<soul::AST::Expression> local_38;
  pool_ptr<soul::AST::Expression> local_30;
  
  lVar2 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::SubscriptWithBrackets::typeinfo,0);
  if (lVar2 == 0) {
    lVar2 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::SubscriptWithChevrons::typeinfo,0);
    if (lVar2 == 0) {
      lVar2 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::DotOperator::typeinfo,0);
      if (lVar2 == 0) {
        q = (QualifiedIdentifier *)
            __dynamic_cast(e,&AST::Expression::typeinfo,&AST::QualifiedIdentifier::typeinfo,0);
        if (q != (QualifiedIdentifier *)0x0) {
          fromIdentifier(__return_storage_ptr__,q);
          return __return_storage_ptr__;
        }
        lVar2 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::Constant::typeinfo,0);
        if (lVar2 != 0) {
          soul::Value::getDescription_abi_cxx11_(&local_58,(Value *)(lVar2 + 0x30),dictionary);
          createText(__return_storage_ptr__,&local_58);
          local_198.field_2._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p == &local_58.field_2) {
            return __return_storage_ptr__;
          }
LAB_0023ea17:
          operator_delete(local_58._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          return __return_storage_ptr__;
        }
        lVar2 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::TypeMetaFunction::typeinfo,0);
        if (lVar2 == 0) {
          local_348._M_unused._M_object = &local_328;
          local_328.sections.
          super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_328.sections.
          super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_328.sections.
          super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_330 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_SourceCodeModel.cpp:149:27)>
                      ::_M_invoke;
          local_338 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_SourceCodeModel.cpp:149:27)>
                      ::_M_manager;
          local_348._8_8_ = e;
          catchParseErrors((function<void_()> *)&local_348);
          if (local_338 != (code *)0x0) {
            (*local_338)(&local_348,&local_348,3);
          }
          if (local_328.sections.
              super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_328.sections.
              super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            SourceCodeUtilities::findRangeOfASTObject
                      ((CodeLocationRange *)&local_348,(ASTObject *)e);
            CodeLocationRange::toString_abi_cxx11_(&local_1f8,(CodeLocationRange *)&local_348);
            choc::text::trim(&local_1d8,&local_1f8);
            createText(__return_storage_ptr__,&local_1d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            CodeLocationRange::~CodeLocationRange((CodeLocationRange *)&local_348);
          }
          else {
            (__return_storage_ptr__->sections).
            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_328.sections.
                 super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (__return_storage_ptr__->sections).
            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_328.sections.
                 super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            (__return_storage_ptr__->sections).
            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_328.sections.
                 super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_328.sections.
            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_328.sections.
            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_328.sections.
            super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          }
          this = &local_328;
        }
        else {
          if (*(int *)(lVar2 + 0x38) == 2) {
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"const ","");
            createKeyword(&local_148,&local_198);
            create((Expression *)&local_348,*(Expression **)(lVar2 + 0x30),dictionary);
            operator+(__return_storage_ptr__,&local_148,(Expression *)&local_348);
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                       *)&local_348);
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector(&local_148.sections);
            local_58._M_dataplus._M_p = local_198._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p == &local_198.field_2) {
              return __return_storage_ptr__;
            }
            goto LAB_0023ea17;
          }
          if (*(int *)(lVar2 + 0x38) == 3) {
            create(&local_130,*(Expression **)(lVar2 + 0x30),dictionary);
            local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"&","");
            createText((Expression *)&local_348,&local_2d8);
            operator+(__return_storage_ptr__,&local_130,(Expression *)&local_348);
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                       *)&local_348);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1
                             );
            }
            this = &local_130;
          }
          else {
            create(&local_178,*(Expression **)(lVar2 + 0x30),dictionary);
            local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,".","");
            createText((Expression *)&local_348,&local_2f8);
            operator+(&local_160,&local_178,(Expression *)&local_348);
            lVar3 = 8;
            while (*(int *)((long)&AST::TypeMetaFunction::names[0].name + lVar3) !=
                   *(int *)(lVar2 + 0x38)) {
              lVar3 = lVar3 + 0x10;
              if (lVar3 == 0x198) {
                throwInternalCompilerError("getNameForOperation",0x756);
              }
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1b8,*(char **)(&UNK_002cb738 + lVar3),
                       (allocator<char> *)&local_310);
            createText(&local_328,&local_1b8);
            operator+(__return_storage_ptr__,&local_160,&local_328);
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector(&local_328.sections);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector(&local_160.sections);
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                       *)&local_348);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            this = &local_178;
          }
        }
      }
      else {
        create(&local_118,*(Expression **)(lVar2 + 0x30),dictionary);
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,".","");
        createText((Expression *)&local_348,&local_298);
        operator+(&local_100,&local_118,(Expression *)&local_348);
        plVar1 = *(long **)(*(long *)(lVar2 + 0x38) + 0x30);
        if (plVar1 == (long *)0x0) {
          throwInternalCompilerError("isValid()","toString",0x23);
        }
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_2b8,*plVar1,plVar1[1] + *plVar1);
        createText(&local_328,&local_2b8);
        operator+(__return_storage_ptr__,&local_100,&local_328);
        std::
        vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
        ::~vector(&local_328.sections);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
        ::~vector(&local_100.sections);
        std::
        vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
        ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                   *)&local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        this = &local_118;
      }
    }
    else {
      create(&local_e8,*(Expression **)(lVar2 + 0x30),dictionary);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"<","");
      createText((Expression *)&local_348,&local_258);
      operator+(&local_d0,&local_e8,(Expression *)&local_348);
      local_38.object = *(Expression **)(lVar2 + 0x38);
      createIfNotNull(&local_328,&local_38,dictionary);
      operator+(&local_b8,&local_d0,&local_328);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,">","");
      createText(&local_310,&local_278);
      operator+(__return_storage_ptr__,&local_b8,&local_310);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_310.sections);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_b8.sections);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_328.sections);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector(&local_d0.sections);
      std::
      vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                 *)&local_348);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      this = &local_e8;
    }
  }
  else {
    create(&local_a0,*(Expression **)(lVar2 + 0x30),dictionary);
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"[","");
    createText((Expression *)&local_348,&local_218);
    operator+(&local_88,&local_a0,(Expression *)&local_348);
    local_30.object = *(Expression **)(lVar2 + 0x38);
    createIfNotNull(&local_328,&local_30,dictionary);
    operator+(&local_70,&local_88,&local_328);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"]","");
    createText(&local_310,&local_238);
    operator+(__return_storage_ptr__,&local_70,&local_310);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_310.sections);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_70.sections);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_328.sections);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector(&local_88.sections);
    std::
    vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
    ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
               *)&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    this = &local_a0;
  }
  std::
  vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
  ::~vector(&this->sections);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression create (AST::Expression& e, const StringDictionary& dictionary)
    {
        if (auto s = cast<AST::SubscriptWithBrackets> (e))  return create (s->lhs, dictionary) + createText ("[") + createIfNotNull (s->rhs, dictionary) + createText ("]");
        if (auto s = cast<AST::SubscriptWithChevrons> (e))  return create (s->lhs, dictionary) + createText ("<") + createIfNotNull (s->rhs, dictionary) + createText (">");
        if (auto d = cast<AST::DotOperator> (e))            return create (d->lhs, dictionary) + createText (".") + createText (d->rhs.identifier.toString());
        if (auto q = cast<AST::QualifiedIdentifier> (e))    return fromIdentifier (*q);
        if (auto c = cast<AST::Constant> (e))               return createText (c->value.getDescription (std::addressof (dictionary)));

        if (auto m = cast<AST::TypeMetaFunction> (e))
        {
            if (m->operation == AST::TypeMetaFunction::Op::makeReference)
                return create (m->source, dictionary) + createText ("&");

            if (m->operation == AST::TypeMetaFunction::Op::makeConst)
                return createKeyword ("const ") + create (m->source, dictionary);

            return create (m->source, dictionary) + createText (".") + createText (AST::TypeMetaFunction::getNameForOperation (m->operation));
        }

        SourceCodeModel::Expression result;
        catchParseErrors ([&] { result = create (e.resolveAsType()); });

        if (! result.sections.empty())
            return result;

        return createText (choc::text::trim (SourceCodeUtilities::findRangeOfASTObject (e).toString()));
    }